

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_disconnect(connectdata *conn,_Bool dead_connection)

{
  anon_union_264_9_0449b319_for_proto *pp;
  connectdata *pcVar1;
  char **ppcVar2;
  CURLcode CVar3;
  undefined7 in_register_00000031;
  smtp_conn *smtpc;
  
  pp = &conn->proto;
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (pcVar1 = (conn->proto).ftpc.pp.conn, pcVar1 != (connectdata *)0x0)) &&
     ((pcVar1->bits).protoconnstart == true)) {
    CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","QUIT");
    if (CVar3 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_APPEND_FINAL;
      do {
        CVar3 = Curl_pp_statemach(&(pp->ftpc).pp,true);
        if ((conn->proto).imapc.state == IMAP_STOP) break;
      } while (CVar3 == CURLE_OK);
    }
  }
  Curl_pp_disconnect(&(pp->ftpc).pp);
  Curl_sasl_cleanup(conn,(conn->proto).pop3c.authtypes);
  ppcVar2 = (conn->proto).ftpc.dirs;
  if (ppcVar2 != (char **)0x0) {
    (*Curl_cfree)(ppcVar2);
    (conn->proto).ftpc.dirs = (char **)0x0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The SMTP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && smtpc->pp.conn && smtpc->pp.conn->bits.protoconnstart)
    if(!smtp_perform_quit(conn))
      (void)smtp_block_statemach(conn); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&smtpc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, smtpc->authused);

  /* Cleanup our connection based variables */
  Curl_safefree(smtpc->domain);

  return CURLE_OK;
}